

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O2

bam1_t * bam_copy1(bam1_t *bdst,bam1_t *bsrc)

{
  undefined8 uVar1;
  uint8_t *puVar2;
  int32_t iVar3;
  int32_t iVar4;
  int32_t iVar5;
  int32_t iVar6;
  int32_t iVar7;
  int32_t iVar8;
  int iVar9;
  uint8_t *__ptr;
  uint uVar10;
  int iVar11;
  
  __ptr = bdst->data;
  iVar11 = bdst->m_data;
  iVar9 = bsrc->l_data;
  if (iVar11 < iVar9) {
    uVar10 = (int)(iVar9 - 1U) >> 1 | iVar9 - 1U;
    uVar10 = (int)uVar10 >> 2 | uVar10;
    uVar10 = (int)uVar10 >> 4 | uVar10;
    uVar10 = (int)uVar10 >> 8 | uVar10;
    iVar11 = ((int)uVar10 >> 0x10 | uVar10) + 1;
    __ptr = (uint8_t *)realloc(__ptr,(long)iVar11);
    iVar9 = bsrc->l_data;
  }
  memcpy(__ptr,bsrc->data,(long)iVar9);
  iVar3 = (bsrc->core).tid;
  iVar4 = (bsrc->core).pos;
  uVar1 = *(undefined8 *)&(bsrc->core).field_0x8;
  iVar5 = (bsrc->core).l_qseq;
  iVar6 = (bsrc->core).mtid;
  iVar7 = (bsrc->core).mpos;
  iVar8 = (bsrc->core).isize;
  iVar9 = bsrc->m_data;
  puVar2 = bsrc->data;
  bdst->l_data = bsrc->l_data;
  bdst->m_data = iVar9;
  bdst->data = puVar2;
  (bdst->core).tid = iVar3;
  (bdst->core).pos = iVar4;
  *(undefined8 *)&(bdst->core).field_0x8 = uVar1;
  (bdst->core).l_qseq = iVar5;
  (bdst->core).mtid = iVar6;
  (bdst->core).mpos = iVar7;
  (bdst->core).isize = iVar8;
  bdst->id = bsrc->id;
  bdst->m_data = iVar11;
  bdst->data = __ptr;
  return bdst;
}

Assistant:

bam1_t *bam_copy1(bam1_t *bdst, const bam1_t *bsrc)
{
    uint8_t *data = bdst->data;
    int m_data = bdst->m_data;   // backup data and m_data
    if (m_data < bsrc->l_data) { // double the capacity
        m_data = bsrc->l_data; kroundup32(m_data);
        data = (uint8_t*)realloc(data, m_data);
    }
    memcpy(data, bsrc->data, bsrc->l_data); // copy var-len data
    *bdst = *bsrc; // copy the rest
    // restore the backup
    bdst->m_data = m_data;
    bdst->data = data;
    return bdst;
}